

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::(anonymous_namespace)::NegativeGLSLCompileTime::Shader1_abi_cxx11_
          (string *__return_storage_ptr__,NegativeGLSLCompileTime *this,int binding)

{
  ostream *poVar1;
  string *psVar2;
  stringstream ss;
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"\nlayout(binding = ",0x12);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_190,(int)this);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,") buffer Buffer {\n  int x;\n};\nvoid main() {\n  x = 0;\n}",0x36);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  psVar2 = (string *)std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return psVar2;
}

Assistant:

static std::string Shader1(int binding)
	{
		std::stringstream ss;
		ss << NL "layout(binding = " << binding
		   << ") buffer Buffer {" NL "  int x;" NL "};" NL "void main() {" NL "  x = 0;" NL "}";
		return ss.str();
	}